

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kalman_filter.cpp
# Opt level: O3

VectorXd h(VectorXd *x)

{
  double dVar1;
  double dVar2;
  ulong uVar3;
  double *pdVar4;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *this;
  DenseIndex extraout_RDX;
  undefined8 *in_RSI;
  float fVar5;
  float fVar6;
  float fVar7;
  VectorXd VVar8;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_40;
  double local_20;
  double local_18;
  
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)x,3,3,1);
  uVar3 = in_RSI[1];
  if ((((0 < (long)uVar3) && (uVar3 != 1)) && (2 < uVar3)) && (uVar3 != 3)) {
    pdVar4 = (double *)*in_RSI;
    fVar6 = (float)*pdVar4;
    fVar7 = (float)pdVar4[1];
    dVar1 = pdVar4[2];
    dVar2 = pdVar4[3];
    fVar5 = SQRT(fVar6 * fVar6 + fVar7 * fVar7);
    local_40.m_row = 0;
    local_40.m_col = 1;
    local_40.m_currentBlockRows = 1;
    *(x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data =
         (double)fVar5;
    local_40.m_xpr = x;
    local_18 = atan2((double)fVar7,(double)fVar6);
    this = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (&local_40,&local_18);
    local_20 = (double)((fVar6 * (float)dVar1 + fVar7 * (float)dVar2) / fVar5);
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(this,&local_20);
    if ((local_40.m_currentBlockRows + local_40.m_row ==
         ((local_40.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
         m_storage.m_rows) && (local_40.m_col == 1)) {
      VVar8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
           extraout_RDX;
      VVar8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)x;
      return (VectorXd)
             VVar8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
    }
    __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/preritj[P]Extended-Kalman-Filter/src/Eigen/src/Core/CommaInitializer.h"
                  ,0x6f,
                  "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, -1, 1>>::finished() [MatrixType = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  __assert_fail("index >= 0 && index < size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/preritj[P]Extended-Kalman-Filter/src/Eigen/src/Core/DenseCoeffsBase.h"
                ,0xad,
                "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
               );
}

Assistant:

VectorXd h(const VectorXd &x){
	VectorXd h_(3);
	// read state vector
	float px = x(0);
	float py = x(1);
	float vx = x(2);
	float vy = x(3);

	// pre-compute term
	float c = sqrt(px*px + py*py);

	// set h function
	h_ << c, atan2(py,px), (px*vx + py*vy)/c;
	return h_;
}